

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmGetSource(void *arg,char *name)

{
  cmCPluginAPISourceFile **__return_storage_ptr__;
  bool bVar1;
  cmSourceFile *pcVar2;
  cmCPluginAPISourceFile *this;
  string *psVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  undefined1 local_d0 [8];
  value_type entry;
  string local_a0;
  cmCPluginAPISourceFile *local_80;
  cmCPluginAPISourceFile *sf;
  _Self local_70;
  iterator i;
  allocator local_51;
  string local_50;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmMakefile *mf;
  char *name_local;
  void *arg_local;
  
  rsf = (cmSourceFile *)arg;
  mf = (cmMakefile *)name;
  name_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  pcVar2 = cmMakefile::GetSource((cmMakefile *)arg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (pcVar2 == (cmSourceFile *)0x0) {
    arg_local = (void *)0x0;
  }
  else {
    local_30 = pcVar2;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
         ::find(&cmCPluginAPISourceFiles.
                 super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                ,&local_30);
    sf = (cmCPluginAPISourceFile *)
         std::
         map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
         ::end(&cmCPluginAPISourceFiles.
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              );
    bVar1 = std::operator==(&local_70,(_Self *)&sf);
    if (bVar1) {
      this = (cmCPluginAPISourceFile *)operator_new(0xb0);
      cmCPluginAPISourceFile::cmCPluginAPISourceFile(this);
      this->RealSourceFile = local_30;
      local_80 = this;
      psVar3 = cmSourceFile::GetFullPath(local_30,(string *)0x0);
      std::__cxx11::string::operator=((string *)&local_80->FullPath,(string *)psVar3);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_a0,&local_80->FullPath);
      std::__cxx11::string::operator=((string *)&local_80->SourceName,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      __return_storage_ptr__ = &entry.second;
      cmsys::SystemTools::GetFilenameLastExtension
                ((string *)__return_storage_ptr__,&local_80->FullPath);
      std::__cxx11::string::operator=
                ((string *)&local_80->SourceExtension,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>::
      pair<cmSourceFile_*&,_cmCPluginAPISourceFile_*&,_true>
                ((pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)local_d0,&local_30,&local_80
                );
      _Var5 = std::
              map<cmSourceFile*,cmCPluginAPISourceFile*,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
              ::insert<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>&>
                        ((map<cmSourceFile*,cmCPluginAPISourceFile*,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,cmCPluginAPISourceFile*>>>
                          *)&cmCPluginAPISourceFiles,
                         (pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*> *)local_d0);
      local_70._M_node = (_Base_ptr)_Var5.first._M_node;
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>::
             operator->(&local_70);
    arg_local = ppVar4->second;
  }
  return arg_local;
}

Assistant:

void CCONV *cmGetSource(void *arg, const char *name)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  if(cmSourceFile* rsf = mf->GetSource(name))
    {
    // Lookup the proxy source file object for this source.
    cmCPluginAPISourceFileMap::iterator i = cmCPluginAPISourceFiles.find(rsf);
    if(i == cmCPluginAPISourceFiles.end())
      {
      // Create a proxy source file object for this source.
      cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->GetFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      cmCPluginAPISourceFileMap::value_type entry(rsf, sf);
      i = cmCPluginAPISourceFiles.insert(entry).first;
      }
    return (void *)i->second;
    }
  else
    {
    return 0;
    }
}